

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDispatch<void>::
call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_qpromise_timeout::timeout()::__1>
          (PromiseDispatch<void> *this,QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
          anon_class_16_2_30a9d772 fn)

{
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  anon_class_16_2_30a9d772 fn_local;
  
  fn_local.elapsed = fn.elapsed;
  resolve_local = (QPromiseResolve<void> *)reject;
  tst_qpromise_timeout::timeout::anon_class_16_2_30a9d772::operator()
            ((anon_class_16_2_30a9d772 *)&resolve_local);
  QtPromise::QPromiseResolve<void>::operator()((QPromiseResolve<void> *)this);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }